

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O2

bool axl::io::matchWildcard(StringRef *string0,StringRef *wildcard0)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(wildcard0);
  if (string0->m_length != 0) {
    pcVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(string0);
    pcVar6 = (char *)0x0;
    pcVar7 = (char *)0x0;
LAB_00131891:
    do {
      cVar1 = *pcVar2;
      while( true ) {
        pcVar4 = pcVar3;
        if (cVar1 == '*') goto LAB_001318d3;
        if ((cVar1 == '?') || (cVar5 = *pcVar3, cVar5 == cVar1)) goto LAB_001318ee;
        if (pcVar7 == (char *)0x0) {
          return false;
        }
        if ((pcVar2 == pcVar7) || (cVar1 = *pcVar7, pcVar2 = pcVar7 + 1, cVar5 == cVar1)) break;
        pcVar3 = pcVar6 + 1;
        pcVar6 = pcVar3;
        pcVar2 = pcVar7;
      }
      pcVar3 = pcVar3 + 1;
      if (cVar5 == '\0') {
        return false;
      }
    } while( true );
  }
  do {
    cVar1 = *pcVar2;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 == '*');
LAB_0013191a:
  return cVar1 == '\0';
LAB_001318d3:
  do {
    cVar1 = pcVar2[1];
    pcVar2 = pcVar2 + 1;
  } while (cVar1 == '*');
  if (cVar1 == '\0') {
    return true;
  }
  pcVar6 = pcVar3;
  pcVar7 = pcVar2;
  if (cVar1 != '?') {
    cVar5 = *pcVar3;
    while (pcVar4 = pcVar3, pcVar6 = pcVar3, cVar5 != cVar1) {
      cVar5 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
      if (cVar5 == '\0') {
        return false;
      }
    }
  }
LAB_001318ee:
  pcVar3 = pcVar4 + 1;
  pcVar2 = pcVar2 + 1;
  if (pcVar4[1] == '\0') goto LAB_00131921;
  goto LAB_00131891;
LAB_00131921:
  do {
    cVar1 = *pcVar2;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 == '*');
  goto LAB_0013191a;
}

Assistant:

bool
matchWildcard(
	const sl::StringRef& string0,
	const sl::StringRef& wildcard0
) {
	const char* wildcard = wildcard0.sz();

	if (string0.isEmpty()) { // empty input shortcut
		while (*wildcard == '*')
			wildcard++;

		return *wildcard == '\0';
	}

	const char* string = string0.sz();
	const char* stringBookmark = NULL;
	const char* wildcardBookmark = NULL;
	char c;

	for (;;) {
		if (*wildcard == '*') {
			while (*++wildcard == '*')
				;

			if (!*wildcard)
				return true;

			if (*wildcard != '?') {
				while (*string != *wildcard) {
					if (!(*(++string)))
						return false;
				}
			}

			wildcardBookmark = wildcard;
			stringBookmark = string;
		} else {
			c = *string;
			if (c != *wildcard && *wildcard != '?') {
				if (wildcardBookmark) {
					if (wildcard != wildcardBookmark) {
						wildcard = wildcardBookmark;

						if (c != *wildcard) {
							string = ++stringBookmark;
							continue;
						} else {
							wildcard++;
						}
					}

					if (*string) {
						string++;
						continue;
					}
				}

				return false;
			}
		}

		string++;
		wildcard++;

		if (!*string) {
			while (*wildcard == '*')
				wildcard++;

			return !*wildcard;
		}
	}
}